

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBegin_usingDict(ZSTD_CCtx *cctx,void *dict,size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  ZSTD_parameters params;
  ZSTD_CCtx_params cctxParams;
  
  ZSTD_getCParams_internal
            (&params.cParams,compressionLevel,0xffffffffffffffff,dictSize,ZSTD_cpm_noAttachDict);
  params.fParams.noDictIDFlag = 0;
  params.fParams.contentSizeFlag = 1;
  params.fParams.checksumFlag = 0;
  cctxParams.compressionLevel = 3;
  if (compressionLevel != 0) {
    cctxParams.compressionLevel = compressionLevel;
  }
  memset(&cctxParams,0,0xb0);
  cctxParams.fParams.contentSizeFlag = params.fParams.contentSizeFlag;
  cctxParams.fParams.checksumFlag = params.fParams.checksumFlag;
  cctxParams.fParams.noDictIDFlag = params.fParams.noDictIDFlag;
  if ((cctxParams.useRowMatchFinder == ZSTD_urm_auto) &&
     (cctxParams.useRowMatchFinder = ZSTD_urm_disableRowMatchFinder,
     0xfffffffc < params.cParams.strategy - ZSTD_btlazy2)) {
    cctxParams.useRowMatchFinder = ZSTD_urm_enableRowMatchFinder - (params.cParams.windowLog < 0xf);
  }
  sVar1 = ZSTD_compressBegin_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,&cctxParams,
                     0xffffffffffffffff,ZSTDb_not_buffered);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_usingDict(ZSTD_CCtx* cctx, const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_CCtx_params cctxParams;
    {
        ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_noAttachDict);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : compressionLevel);
    }
    DEBUGLOG(4, "ZSTD_compressBegin_usingDict (dictSize=%u)", (unsigned)dictSize);
    return ZSTD_compressBegin_internal(cctx, dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast, NULL,
                                       &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, ZSTDb_not_buffered);
}